

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

Point3fi * __thiscall
pbrt::Point3fi::operator-
          (Point3fi *__return_storage_ptr__,Point3fi *this,Vector3<pbrt::Interval<float>_> *v)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Interval<float> IVar3;
  Interval<float> IVar4;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar5 [64];
  undefined1 extraout_var [56];
  
  IVar3 = Interval<float>::operator-<float>
                    ((Interval<float> *)this,
                     (v->super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>).x);
  IVar4 = Interval<float>::operator-<float>
                    (&(this->super_Point3<pbrt::Interval<float>_>).
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y,
                     (v->super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>).y);
  auVar5._0_8_ = Interval<float>::operator-<float>
                           (&(this->super_Point3<pbrt::Interval<float>_>).
                             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z,
                            (v->super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>).z);
  auVar5._8_56_ = extraout_var;
  auVar2._8_8_ = extraout_XMM0_Qb;
  auVar2._0_4_ = IVar3.low;
  auVar2._4_4_ = IVar3.high;
  auVar1._8_8_ = extraout_XMM0_Qb_00;
  auVar1._0_4_ = IVar4.low;
  auVar1._4_4_ = IVar4.high;
  auVar1 = vunpcklpd_avx(auVar2,auVar1);
  (__return_storage_ptr__->super_Point3<pbrt::Interval<float>_>).
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = (float)(int)auVar1._0_8_;
  (__return_storage_ptr__->super_Point3<pbrt::Interval<float>_>).
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high =
       (float)(int)((ulong)auVar1._0_8_ >> 0x20);
  (__return_storage_ptr__->super_Point3<pbrt::Interval<float>_>).
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = (float)(int)auVar1._8_8_;
  (__return_storage_ptr__->super_Point3<pbrt::Interval<float>_>).
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high =
       (float)(int)((ulong)auVar1._8_8_ >> 0x20);
  IVar3 = (Interval<float>)vmovlps_avx(auVar5._0_16_);
  (__return_storage_ptr__->super_Point3<pbrt::Interval<float>_>).
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = IVar3;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU Point3fi operator-(const Vector3<U> &v) const {
        DCHECK(!v.HasNaN());
        return {x - v.x, y - v.y, z - v.z};
    }